

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::GenvarDeclarationSyntax::GenvarDeclarationSyntax
          (GenvarDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *identifiers,Token semi)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  IdentifierNameSyntax *pIVar4;
  undefined8 uVar5;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *__range2;
  iterator_base<slang::syntax::IdentifierNameSyntax_*> local_30;
  
  uVar5 = keyword._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,GenvarDeclaration,attributes);
  (this->keyword).kind = (short)uVar5;
  (this->keyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->keyword).info = keyword.info;
  uVar3 = *(undefined4 *)&(identifiers->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (identifiers->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->identifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (identifiers->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->identifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->identifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->identifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (identifiers->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->identifiers).super_SyntaxListBase.childCount =
       (identifiers->super_SyntaxListBase).childCount;
  (this->identifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00b6f2a0;
  sVar1 = (identifiers->elements)._M_extent._M_extent_value;
  (this->identifiers).elements._M_ptr = (identifiers->elements)._M_ptr;
  (this->identifiers).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->identifiers).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  local_30.index = 0;
  sVar1 = (this->identifiers).elements._M_extent._M_extent_value;
  local_30.list = &this->identifiers;
  for (; (local_30.list != &this->identifiers || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pIVar4 = SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
             iterator_base<slang::syntax::IdentifierNameSyntax_*>::dereference(&local_30);
    (pIVar4->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

GenvarDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<IdentifierNameSyntax>& identifiers, Token semi) :
        MemberSyntax(SyntaxKind::GenvarDeclaration, attributes), keyword(keyword), identifiers(identifiers), semi(semi) {
        this->identifiers.parent = this;
        for (auto child : this->identifiers)
            child->parent = this;
    }